

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall CLI::Option::check_name(Option *this,string *name)

{
  char *pcVar1;
  bool bVar2;
  __type _Var3;
  string *this_00;
  string local_150;
  string local_name;
  string local_pname;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (name->_M_string_length < 3) {
    if ((name->_M_string_length != 2) || (*(name->_M_dataplus)._M_p != '-')) goto LAB_00134545;
  }
  else {
    pcVar1 = (name->_M_dataplus)._M_p;
    if (*pcVar1 != '-') {
LAB_00134545:
      if ((this->pname_)._M_string_length != 0) {
        ::std::__cxx11::string::string((string *)&local_pname,(string *)&this->pname_);
        ::std::__cxx11::string::string((string *)&local_name,(string *)name);
        if ((this->super_OptionBase<CLI::Option>).ignore_underscore_ == true) {
          ::std::__cxx11::string::string((string *)&local_90,(string *)&local_pname);
          detail::remove_underscore(&local_150,&local_90);
          ::std::__cxx11::string::operator=((string *)&local_pname,(string *)&local_150);
          ::std::__cxx11::string::~string((string *)&local_150);
          ::std::__cxx11::string::~string((string *)&local_90);
          ::std::__cxx11::string::string((string *)&local_b0,(string *)&local_name);
          detail::remove_underscore(&local_150,&local_b0);
          ::std::__cxx11::string::operator=((string *)&local_name,(string *)&local_150);
          ::std::__cxx11::string::~string((string *)&local_150);
          ::std::__cxx11::string::~string((string *)&local_b0);
        }
        if ((this->super_OptionBase<CLI::Option>).ignore_case_ == true) {
          ::std::__cxx11::string::string((string *)&local_d0,(string *)&local_pname);
          detail::to_lower(&local_150,&local_d0);
          ::std::__cxx11::string::operator=((string *)&local_pname,(string *)&local_150);
          ::std::__cxx11::string::~string((string *)&local_150);
          ::std::__cxx11::string::~string((string *)&local_d0);
          ::std::__cxx11::string::string((string *)&local_f0,(string *)&local_name);
          detail::to_lower(&local_150,&local_f0);
          ::std::__cxx11::string::operator=((string *)&local_name,(string *)&local_150);
          ::std::__cxx11::string::~string((string *)&local_150);
          ::std::__cxx11::string::~string((string *)&local_f0);
        }
        _Var3 = ::std::operator==(&local_name,&local_pname);
        ::std::__cxx11::string::~string((string *)&local_name);
        ::std::__cxx11::string::~string((string *)&local_pname);
        if (_Var3) {
          return true;
        }
      }
      if ((this->envname_)._M_string_length != 0) {
        _Var3 = ::std::operator==(name,&this->envname_);
        return _Var3;
      }
      return false;
    }
    if (pcVar1[1] == '-') {
      ::std::__cxx11::string::substr((ulong)&local_50,(ulong)name);
      bVar2 = check_lname(this,&local_50);
      this_00 = &local_50;
      goto LAB_0013453b;
    }
  }
  ::std::__cxx11::string::substr((ulong)&local_70,(ulong)name);
  bVar2 = check_sname(this,&local_70);
  this_00 = &local_70;
LAB_0013453b:
  ::std::__cxx11::string::~string((string *)this_00);
  return bVar2;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE bool Option::check_name(const std::string &name) const {

    if(name.length() > 2 && name[0] == '-' && name[1] == '-')
        return check_lname(name.substr(2));
    if(name.length() > 1 && name.front() == '-')
        return check_sname(name.substr(1));
    if(!pname_.empty()) {
        std::string local_pname = pname_;
        std::string local_name = name;
        if(ignore_underscore_) {
            local_pname = detail::remove_underscore(local_pname);
            local_name = detail::remove_underscore(local_name);
        }
        if(ignore_case_) {
            local_pname = detail::to_lower(local_pname);
            local_name = detail::to_lower(local_name);
        }
        if(local_name == local_pname) {
            return true;
        }
    }

    if(!envname_.empty()) {
        // this needs to be the original since envname_ shouldn't match on case insensitivity
        return (name == envname_);
    }
    return false;
}